

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDOMWrapRemoveNode(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlDocPtr val_00;
  xmlNodePtr val_01;
  uint local_4c;
  int n_options;
  int options;
  int n_node;
  xmlNodePtr node;
  int n_doc;
  xmlDocPtr doc;
  int n_ctxt;
  xmlDOMWrapCtxtPtr_conflict ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 1; doc._4_4_ = doc._4_4_ + 1) {
    for (node._4_4_ = 0; (int)node._4_4_ < 4; node._4_4_ = node._4_4_ + 1) {
      for (n_options = 0; n_options < 3; n_options = n_options + 1) {
        for (local_4c = 0; (int)local_4c < 4; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val_00 = gen_xmlDocPtr(node._4_4_,1);
          val_01 = gen_xmlNodePtr(n_options,2);
          iVar2 = gen_int(local_4c,3);
          val = xmlDOMWrapRemoveNode(0,val_00,val_01,iVar2);
          desret_int(val);
          call_tests = call_tests + 1;
          des_xmlDocPtr(node._4_4_,val_00,1);
          des_xmlNodePtr(n_options,val_01,2);
          des_int(local_4c,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDOMWrapRemoveNode",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)doc._4_4_);
            printf(" %d",(ulong)node._4_4_);
            printf(" %d",(ulong)(uint)n_options);
            printf(" %d",(ulong)local_4c);
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlDOMWrapRemoveNode(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlDOMWrapCtxtPtr ctxt; /* a DOM wrapper context */
    int n_ctxt;
    xmlDocPtr doc; /* the doc */
    int n_doc;
    xmlNodePtr node; /* the node to be removed. */
    int n_node;
    int options; /* set of options, unused at the moment */
    int n_options;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlDOMWrapCtxtPtr;n_ctxt++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlDOMWrapCtxtPtr(n_ctxt, 0);
        doc = gen_xmlDocPtr(n_doc, 1);
        node = gen_xmlNodePtr(n_node, 2);
        options = gen_int(n_options, 3);

        ret_val = xmlDOMWrapRemoveNode(ctxt, doc, node, options);
        desret_int(ret_val);
        call_tests++;
        des_xmlDOMWrapCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        des_xmlNodePtr(n_node, node, 2);
        des_int(n_options, options, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDOMWrapRemoveNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_doc);
            printf(" %d", n_node);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}